

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

SpanReader * __thiscall
SpanReader::operator>>
          (SpanReader *this,
          Wrapper<(anonymous_namespace)::DepGraphFormatter,_cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>_&>
          *obj)

{
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *pDVar1;
  uint uVar2;
  ClusterIndex child;
  unsigned_long uVar3;
  ulong uVar4;
  long lVar5;
  pointer puVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  Span<const_unsigned_int> mapping;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reordering;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> topo_depgraph;
  _Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = obj->m_object;
  topo_depgraph.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  topo_depgraph.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  topo_depgraph.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reordering.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reordering.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reordering.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    uVar2 = ReadVarInt<SpanReader,(VarIntMode)1,int>(this);
    if (((uVar2 & 0x3fffff) == 0) ||
       ((long)topo_depgraph.entries.
              super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)topo_depgraph.entries.
              super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x300)) break;
    uVar3 = ReadVarInt<SpanReader,(VarIntMode)0,unsigned_long>(this);
    local_50._M_impl.super__Vector_impl_data._M_start =
         (pointer)(-(ulong)((uint)uVar3 & 1) ^ uVar3 >> 1 & 0x7ffffffffffff);
    local_50._M_impl.super__Vector_impl_data._M_finish._0_4_ = uVar2 & 0x3fffff;
    child = cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::AddTransaction
                      (&topo_depgraph,(FeeFrac *)&local_50);
    local_50._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_50._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (int)((ulong)((long)reordering.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)reordering.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 2));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&reordering,(uint *)&local_50);
    uVar4 = ReadVarInt<SpanReader,(VarIntMode)0,unsigned_long>(this);
    uVar7 = (ulong)child;
    while (uVar7 != 0) {
      uVar7 = uVar7 - 1;
      if ((topo_depgraph.entries.
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7 & 0xffffffff].descendants.m_val &
          1 << ((byte)child & 0x1f)) == 0) {
        if (uVar4 == 0) {
          cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::AddDependency
                    (&topo_depgraph,(ClusterIndex)uVar7,child);
          uVar4 = ReadVarInt<SpanReader,(VarIntMode)0,unsigned_long>(this);
        }
        else {
          uVar4 = uVar4 - 1;
        }
      }
    }
    reordering.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         reordering.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    lVar5 = (long)reordering.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)reordering.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start >> 2;
    uVar4 = uVar4 % (lVar5 + 1U);
    for (puVar6 = reordering.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start;
        puVar6 != reordering.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
      *puVar6 = (*puVar6 + 1) - (uint)((ulong)*puVar6 < lVar5 - (uVar4 & 0xffffffff));
    }
    local_50._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_50._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (int)lVar5 - (int)uVar4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&reordering,(uint *)&local_50);
  }
  mapping.m_size =
       (long)reordering.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)reordering.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  mapping.m_data =
       reordering.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph
            ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)&local_50,&topo_depgraph,mapping);
  std::
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ::_M_move_assign(&pDVar1->entries,&local_50);
  std::
  _Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ::~_Vector_base(&local_50);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&reordering.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  _Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ::~_Vector_base((_Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                   *)&topo_depgraph);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

SpanReader& operator>>(T&& obj)
    {
        ::Unserialize(*this, obj);
        return (*this);
    }